

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

bool __thiscall deqp::gls::DrawTestSpec::valid(DrawTestSpec *this)

{
  int iVar1;
  deUint32 dVar2;
  bool bVar3;
  byte bVar4;
  unsigned_short uVar5;
  ApiType other;
  int iVar6;
  Profile PVar7;
  MethodInfo MVar8;
  size_type sVar9;
  const_reference pvVar10;
  GLValue GVar11;
  int local_68;
  int ndx_1;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_58;
  InputType local_50;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_48;
  InputType local_40;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_38;
  uint local_2c;
  deUint32 local_28;
  deUint32 maxIndexValue;
  undefined1 auStack_1e [2];
  int ndx;
  DrawTestSpec *pDStack_18;
  MethodInfo methodInfo;
  DrawTestSpec *this_local;
  
  pDStack_18 = this;
  MVar8 = anon_unknown_1::getMethodInfo(this->drawMethod);
  _auStack_1e = MVar8._0_4_;
  ndx._2_2_ = MVar8._4_2_;
  for (maxIndexValue = 0; dVar2 = maxIndexValue,
      sVar9 = std::
              vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
              ::size(&this->attribs), (int)dVar2 < (int)sVar9; maxIndexValue = maxIndexValue + 1) {
    pvVar10 = std::
              vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
              ::operator[](&this->attribs,(long)(int)maxIndexValue);
    local_28 = (this->apiType).m_bits;
    bVar3 = AttributeSpec::valid(pvVar10,(ApiType)local_28);
    if (!bVar3) {
      return false;
    }
  }
  if ((_auStack_1e & 0x10000) != 0) {
    local_2c = 0;
    if (this->indexType == INDEXTYPE_BYTE) {
      GVar11 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_BYTE);
      local_38 = GVar11.field_1;
      local_40 = GVar11.type;
      bVar4 = anon_unknown_1::GLValue::WrappedType<unsigned_char>::getValue
                        ((WrappedType<unsigned_char> *)&local_38.fl);
      local_2c = (uint)bVar4;
    }
    else if (this->indexType == INDEXTYPE_SHORT) {
      GVar11 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_SHORT);
      local_48 = GVar11.field_1;
      local_50 = GVar11.type;
      uVar5 = anon_unknown_1::GLValue::WrappedType<unsigned_short>::getValue
                        ((WrappedType<unsigned_short> *)&local_48.fl);
      local_2c = (uint)uVar5;
    }
    else if (this->indexType == INDEXTYPE_INT) {
      GVar11 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_UNSIGNED_INT);
      local_58 = GVar11.field_1;
      local_2c = anon_unknown_1::GLValue::WrappedType<unsigned_int>::getValue
                           ((WrappedType<unsigned_int> *)&local_58.fl);
    }
    if (this->indexMax < this->indexMin) {
      return false;
    }
    if ((this->indexMin < 0) || (this->indexMax < 0)) {
      return false;
    }
    if ((local_2c < (uint)this->indexMin) || (local_2c < (uint)this->indexMax)) {
      return false;
    }
  }
  if (((_auStack_1e & 0x1000000) != 0) && (this->first < 0)) {
    return false;
  }
  other = glu::ApiType::es(2,0);
  bVar3 = glu::ApiType::operator==(&this->apiType,other);
  if (bVar3) {
    if ((this->drawMethod != DRAWMETHOD_DRAWARRAYS) && (this->drawMethod != DRAWMETHOD_DRAWELEMENTS)
       ) {
      return false;
    }
    if (((this->drawMethod == DRAWMETHOD_DRAWELEMENTS) && (this->indexType != INDEXTYPE_BYTE)) &&
       (this->indexType != INDEXTYPE_SHORT)) {
      return false;
    }
  }
  if ((ndx._2_2_ & 0x100) != 0) {
    if (this->indirectOffset % 4 != 0) {
      return false;
    }
    for (local_68 = 0;
        sVar9 = std::
                vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                ::size(&this->attribs), local_68 < (int)sVar9; local_68 = local_68 + 1) {
      pvVar10 = std::
                vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                ::operator[](&this->attribs,(long)local_68);
      if (((pvVar10->useDefaultAttribute & 1U) == 0) &&
         (pvVar10 = std::
                    vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                    ::operator[](&this->attribs,(long)local_68), pvVar10->storage == STORAGE_USER))
      {
        return false;
      }
    }
  }
  if (this->drawMethod == DRAWMETHOD_DRAWELEMENTS_INDIRECT) {
    iVar1 = this->indexPointerOffset;
    iVar6 = indexTypeSize(this->indexType);
    if (iVar1 % iVar6 != 0) {
      return false;
    }
    if (this->indexStorage != STORAGE_BUFFER) {
      return false;
    }
  }
  PVar7 = glu::ApiType::getProfile(&this->apiType);
  if (((PVar7 == PROFILE_CORE) && ((_auStack_1e & 1) != 0)) && (this->indexStorage == STORAGE_USER))
  {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DrawTestSpec::valid (void) const
{
	DE_ASSERT(apiType.getProfile() != glu::PROFILE_LAST);
	DE_ASSERT(primitive != PRIMITIVE_LAST);
	DE_ASSERT(drawMethod != DRAWMETHOD_LAST);

	const MethodInfo methodInfo = getMethodInfo(drawMethod);

	for (int ndx = 0; ndx < (int)attribs.size(); ++ndx)
		if (!attribs[ndx].valid(apiType))
			return false;

	if (methodInfo.ranged)
	{
		deUint32 maxIndexValue = 0;
		if (indexType == INDEXTYPE_BYTE)
			maxIndexValue = GLValue::getMaxValue(INPUTTYPE_UNSIGNED_BYTE).ub.getValue();
		else if (indexType == INDEXTYPE_SHORT)
			maxIndexValue = GLValue::getMaxValue(INPUTTYPE_UNSIGNED_SHORT).us.getValue();
		else if (indexType == INDEXTYPE_INT)
			maxIndexValue = GLValue::getMaxValue(INPUTTYPE_UNSIGNED_INT).ui.getValue();
		else
			DE_ASSERT(DE_FALSE);

		if (indexMin > indexMax)
			return false;
		if (indexMin < 0 || indexMax < 0)
			return false;
		if ((deUint32)indexMin > maxIndexValue || (deUint32)indexMax > maxIndexValue)
			return false;
	}

	if (methodInfo.first && first < 0)
		return false;

	// GLES2 limits
	if (apiType == glu::ApiType::es(2,0))
	{
		if (drawMethod != gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS && drawMethod != gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS)
			return false;
		if (drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS && (indexType != INDEXTYPE_BYTE && indexType != INDEXTYPE_SHORT))
			return false;
	}

	// Indirect limitations
	if (methodInfo.indirect)
	{
		// Indirect offset alignment
		if (indirectOffset % 4 != 0)
			return false;

		// All attribute arrays must be stored in a buffer
		for (int ndx = 0; ndx < (int)attribs.size(); ++ndx)
			if (!attribs[ndx].useDefaultAttribute && attribs[ndx].storage == gls::DrawTestSpec::STORAGE_USER)
				return false;
	}
	if (drawMethod == DRAWMETHOD_DRAWELEMENTS_INDIRECT)
	{
		// index offset must be convertable to firstIndex
		if (indexPointerOffset % gls::DrawTestSpec::indexTypeSize(indexType) != 0)
			return false;

		// Indices must be in a buffer
		if (indexStorage != STORAGE_BUFFER)
			return false;
	}

	// Do not allow user pointer in GL core
	if (apiType.getProfile() == glu::PROFILE_CORE)
	{
		if (methodInfo.indexed && indexStorage == DrawTestSpec::STORAGE_USER)
			return false;
	}

	return true;
}